

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O0

bool SQCompilation::SQCompilationContext::loadConfigFile(char *configFile)

{
  bool bVar1;
  KeyValueFile config;
  KeyValueFile *in_stack_00000220;
  char *in_stack_00000270;
  KeyValueFile *in_stack_00000278;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 local_1;
  
  KeyValueFile::KeyValueFile
            ((KeyValueFile *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  bVar1 = KeyValueFile::loadFromFile(in_stack_00000278,in_stack_00000270);
  if (bVar1) {
    in_stack_ffffffffffffff87 = loadConfigFile(in_stack_00000220);
    local_1 = (bool)in_stack_ffffffffffffff87;
  }
  else {
    local_1 = false;
  }
  KeyValueFile::~KeyValueFile
            ((KeyValueFile *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  return local_1;
}

Assistant:

bool SQCompilationContext::loadConfigFile(const char *configFile) {
  KeyValueFile config;
  if (!config.loadFromFile(configFile)) {
    return false;
  }

  return loadConfigFile(config);
}